

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

Node * __thiscall anon_unknown.dwarf_550beb::Db::parseFunctionParam(Db *this)

{
  char *pcVar1;
  bool bVar2;
  Node *pNVar3;
  StringView S;
  Node NVar4;
  StringView SVar5;
  
  SVar5.Last = "";
  SVar5.First = "fp";
  bVar2 = consumeIf(this,SVar5);
  if (!bVar2) {
    S.Last = "";
    S.First = "fL";
    bVar2 = consumeIf(this,S);
    if (!bVar2) {
      return (Node *)0x0;
    }
    SVar5 = parseNumber(this,false);
    if (SVar5.First == SVar5.Last) {
      return (Node *)0x0;
    }
    pcVar1 = this->First;
    if (pcVar1 == this->Last) {
      return (Node *)0x0;
    }
    if (*pcVar1 != 'p') {
      return (Node *)0x0;
    }
    this->First = pcVar1 + 1;
  }
  parseCVQualifiers(this);
  NVar4 = (Node)parseNumber(this,false);
  pcVar1 = this->First;
  if (pcVar1 == this->Last) {
    return (Node *)0x0;
  }
  if (*pcVar1 != '_') {
    return (Node *)0x0;
  }
  this->First = pcVar1 + 1;
  pNVar3 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
  pNVar3->K = KExpr;
  pNVar3->RHSComponentCache = No;
  pNVar3->ArrayCache = No;
  pNVar3->FunctionCache = No;
  pNVar3->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00216a00;
  pNVar3[1] = NVar4;
  return pNVar3;
}

Assistant:

Node *Db::parseFunctionParam() {
  if (consumeIf("fp")) {
    parseCVQualifiers();
    StringView Num = parseNumber();
    if (!consumeIf('_'))
      return nullptr;
    return make<FunctionParam>(Num);
  }
  if (consumeIf("fL")) {
    if (parseNumber().empty())
      return nullptr;
    if (!consumeIf('p'))
      return nullptr;
    parseCVQualifiers();
    StringView Num = parseNumber();
    if (!consumeIf('_'))
      return nullptr;
    return make<FunctionParam>(Num);
  }
  return nullptr;
}